

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint i;
  uint local_18;
  
  local_18 = 1;
  while( true ) {
    if ((uint)sig <= local_18) {
      return 1;
    }
    if (*(long *)(ctx + (ulong)local_18 * 8) < *(long *)(ctx + (ulong)(local_18 - 1) * 8)) break;
    local_18 = local_18 + 1;
  }
  printf("Verify failed! at %d",(ulong)local_18);
  return 0;
}

Assistant:

int verify(int64_t *dst, const unsigned size) {
  for (unsigned i = 1; i < size; i++) {
    if (dst[i - 1] > dst[i]) {
      printf("Verify failed! at %d", i);
      return 0;
    }
  }
  return 1;
}